

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_units.cpp
# Opt level: O3

int ON_AngleUnitName::Internal_Compare(uint order_selector,ON_AngleUnitName *a,ON_AngleUnitName *b)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  if (order_selector == 1) {
    uVar1 = b->m_locale_id;
    uVar2 = a->m_locale_id;
    if (uVar2 < uVar1) {
      return -1;
    }
    if (uVar2 >= uVar1 && uVar2 != uVar1) {
      return 1;
    }
  }
  if (b->m_angle_unit_system <= a->m_angle_unit_system) {
    if (b->m_angle_unit_system < a->m_angle_unit_system) {
      return 1;
    }
    if (order_selector != 1) {
      if (a->m_locale_id < b->m_locale_id) {
        return -1;
      }
      if (b->m_locale_id < a->m_locale_id) {
        return 1;
      }
    }
    iVar3 = ON_wString::CompareOrdinal(a->m_name,b->m_name,false);
    if (iVar3 != 0) {
      iVar4 = ON_wString::CompareOrdinal(a->m_name,b->m_name,true);
      if (iVar4 != 0) {
        return iVar4;
      }
      return iVar3;
    }
    if (b->m_bNameIsSingular <= a->m_bNameIsSingular) {
      if (b->m_bNameIsSingular < a->m_bNameIsSingular) {
        return 1;
      }
      if (b->m_bNameIsPlural <= a->m_bNameIsPlural) {
        return (uint)(b->m_bNameIsPlural < a->m_bNameIsPlural);
      }
      return -1;
    }
  }
  return -1;
}

Assistant:

int ON_AngleUnitName::Internal_Compare(
  unsigned int order_selector,
  const ON_AngleUnitName& a,
  const ON_AngleUnitName& b
)
{
  if (1 == order_selector)
  {
    // locale id is first
    if (a.m_locale_id < b.m_locale_id)
      return -1;
    if (a.m_locale_id > b.m_locale_id)
      return 1;
  }

  unsigned int i = static_cast<unsigned int>(a.m_angle_unit_system);
  unsigned int j = static_cast<unsigned int>(b.m_angle_unit_system);
  if (i < j)
    return -1;
  if (i > j)
    return 1;

  if (1 != order_selector)
  {
    // localed id is second
    if (a.m_locale_id < b.m_locale_id)
      return -1;
    if (a.m_locale_id > b.m_locale_id)
      return 1;
  }

  i =  ON_wString::CompareOrdinal(a.m_name,b.m_name,false);
  if (i != 0)
  {
    // ignore case order is preferred
    j = ON_wString::CompareOrdinal(a.m_name, b.m_name, true);
    return (0 != j) ? j : i;
  }

  i = a.m_bNameIsSingular ? 1 : 0;
  j = b.m_bNameIsSingular ? 1 : 0;
  if (i < j)
    return -1;
  if (i > j)
    return 1;

  i = a.m_bNameIsPlural ? 1 : 0;
  j = b.m_bNameIsPlural ? 1 : 0;
  if (i < j)
    return -1;
  if (i > j)
    return 1;

  return 0;
}